

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.hpp
# Opt level: O0

void __thiscall yactfr::internal::Vm::_continueSkipPaddingBits(Vm *this,bool contentBits)

{
  unsigned_long_long *puVar1;
  Size local_28;
  Size local_20;
  unsigned_long_long bitsToSkip;
  Vm *pVStack_10;
  bool contentBits_local;
  Vm *this_local;
  
  bitsToSkip._7_1_ = contentBits;
  pVStack_10 = this;
  while ((this->_pos).remBitsToSkip != 0) {
    if ((bitsToSkip._7_1_ & 1) == 0) {
      _requireBits(this,1);
    }
    else {
      _requireContentBits(this,1);
    }
    local_28 = _remBitsInBuf(this);
    puVar1 = std::min<unsigned_long_long>(&(this->_pos).remBitsToSkip,&local_28);
    local_20 = *puVar1;
    (this->_pos).remBitsToSkip = (this->_pos).remBitsToSkip - local_20;
    _consumeExistingBits(this,local_20);
  }
  VmPos::state(&this->_pos,(this->_pos).nextState);
  return;
}

Assistant:

void _continueSkipPaddingBits(const bool contentBits)
    {
        while (_pos.remBitsToSkip > 0) {
            if (contentBits) {
                this->_requireContentBits(1);
            } else {
                this->_requireBits(1);
            }

            const auto bitsToSkip = std::min(_pos.remBitsToSkip, this->_remBitsInBuf());

            _pos.remBitsToSkip -= bitsToSkip;
            this->_consumeExistingBits(bitsToSkip);
        }

        // we're done now!
        _pos.state(_pos.nextState);
    }